

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O2

uint * shift_msg_to_vec(uchar *msg,uint len,uint t,uint *new_len)

{
  uint len_00;
  uint *puVar1;
  ulong uVar2;
  
  len_00 = len + t * 2;
  if (new_len != (uint *)0x0) {
    *new_len = len_00;
  }
  puVar1 = vector_new(len_00);
  for (uVar2 = 0; len != uVar2; uVar2 = uVar2 + 1) {
    puVar1[t * 2 + uVar2] = (uint)msg[uVar2];
  }
  return puVar1;
}

Assistant:

uint32_t *shift_msg_to_vec(uint8_t *msg, uint32_t len, uint32_t t, uint32_t *new_len)
{
    uint32_t v_len = 2 * t + len;

    if (new_len != NULL)
        *new_len = v_len;

    uint32_t *v = vector_new(v_len);
    for (uint32_t i = 0; i < len; i++)
        *(v + 2 * t + i) = msg[i];

    return v;
}